

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::IsPopupOpen(ImGuiID id,ImGuiPopupFlags popup_flags)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  ImGuiPopupData *pIVar6;
  ulong uVar7;
  bool bVar8;
  bool bVar9;
  
  if ((char)popup_flags < '\0') {
    if (id != 0) {
      __assert_fail("id == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                    ,0x1f22,"bool ImGui::IsPopupOpen(ImGuiID, ImGuiPopupFlags)");
    }
    iVar4 = (GImGui->OpenPopupStack).Size;
    if (((uint)popup_flags >> 8 & 1) == 0) {
      iVar1 = (GImGui->BeginPopupStack).Size;
      bVar9 = SBORROW4(iVar4,iVar1);
      bVar8 = iVar4 == iVar1;
      iVar4 = iVar4 - iVar1;
    }
    else {
      bVar9 = false;
      bVar8 = iVar4 == 0;
    }
    bVar8 = !bVar8 && bVar9 == iVar4 < 0;
  }
  else {
    uVar2 = (GImGui->OpenPopupStack).Size;
    if (((uint)popup_flags >> 8 & 1) == 0) {
      uVar3 = (GImGui->BeginPopupStack).Size;
      if ((int)uVar3 < (int)uVar2) {
        if ((int)uVar3 < 0) {
          __assert_fail("i >= 0 && i < Size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.h"
                        ,0x66a,"T &ImVector<ImGuiPopupData>::operator[](int) [T = ImGuiPopupData]");
        }
        bVar8 = (GImGui->OpenPopupStack).Data[uVar3].PopupId == id;
      }
      else {
        bVar8 = false;
      }
    }
    else {
      bVar8 = 0 < (int)uVar2;
      if ((0 < (int)uVar2) && (pIVar6 = (GImGui->OpenPopupStack).Data, pIVar6->PopupId != id)) {
        uVar5 = 1;
        do {
          uVar7 = uVar5;
          pIVar6 = pIVar6 + 1;
          if (uVar2 == uVar7) break;
          uVar5 = uVar7 + 1;
        } while (pIVar6->PopupId != id);
        bVar8 = uVar7 < uVar2;
      }
    }
  }
  return bVar8;
}

Assistant:

bool ImGui::IsPopupOpen(ImGuiID id, ImGuiPopupFlags popup_flags)
{
    ImGuiContext& g = *GImGui;
    if (popup_flags & ImGuiPopupFlags_AnyPopupId)
    {
        // Return true if any popup is open at the current BeginPopup() level of the popup stack
        // This may be used to e.g. test for another popups already opened to handle popups priorities at the same level.
        IM_ASSERT(id == 0);
        if (popup_flags & ImGuiPopupFlags_AnyPopupLevel)
            return g.OpenPopupStack.Size > 0;
        else
            return g.OpenPopupStack.Size > g.BeginPopupStack.Size;
    }
    else
    {
        if (popup_flags & ImGuiPopupFlags_AnyPopupLevel)
        {
            // Return true if the popup is open anywhere in the popup stack
            for (int n = 0; n < g.OpenPopupStack.Size; n++)
                if (g.OpenPopupStack[n].PopupId == id)
                    return true;
            return false;
        }
        else
        {
            // Return true if the popup is open at the current BeginPopup() level of the popup stack (this is the most-common query)
            return g.OpenPopupStack.Size > g.BeginPopupStack.Size && g.OpenPopupStack[g.BeginPopupStack.Size].PopupId == id;
        }
    }
}